

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O1

int Abc_NtkResubstitute(Abc_Ntk_t *pNtk,int nCutMax,int nStepsMax,int nLevelsOdc,int fUpdateLevel,
                       int fVerbose,int fVeryVerbose)

{
  uint *puVar1;
  uint *puVar2;
  undefined4 uVar3;
  void *pvVar4;
  Abc_Ntk_t *pAVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  Abc_Obj_t *pAVar11;
  Odc_Man_t *p;
  int iVar12;
  uint uVar13;
  Abc_ManRes_t *p_00;
  Vec_Ptr_t *pVVar14;
  void **ppvVar15;
  Abc_Obj_t *pAVar16;
  ulong uVar17;
  ProgressBar *p_01;
  int *piVar18;
  Dec_Graph_t *pGraph;
  abctime aVar19;
  abctime aVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  char *__assertion;
  long lVar27;
  ulong uVar28;
  long lVar29;
  void *pvVar30;
  ulong uVar31;
  ulong uVar32;
  Abc_Ntk_t *pNtk_00;
  uint uVar33;
  timespec local_c0;
  uint local_ac;
  Abc_Obj_t *local_a8;
  Vec_Ptr_t *local_a0;
  int local_98;
  int local_94;
  Abc_Ntk_t *local_90;
  Abc_Obj_t *local_88;
  ProgressBar *local_80;
  int local_74;
  int local_70;
  int local_6c;
  Odc_Man_t *local_68;
  long local_60;
  long local_58;
  long local_50;
  Abc_ManCut_t *local_48;
  long local_40;
  long local_38;
  
  local_a0 = (Vec_Ptr_t *)CONCAT44(local_a0._4_4_,nLevelsOdc);
  local_98 = nStepsMax;
  local_94 = fUpdateLevel;
  local_74 = fVerbose;
  iVar12 = clock_gettime(3,&local_c0);
  if (iVar12 < 0) {
    local_60 = -1;
  }
  else {
    local_60 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x96,"int Abc_NtkResubstitute(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  local_90 = pNtk;
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  local_48 = Abc_NtkManCutStart(nCutMax,100000,100000,100000);
  p_00 = (Abc_ManRes_t *)malloc(0x128);
  memset(p_00,0,0x128);
  p_00->nLeavesMax = nCutMax;
  p_00->nDivsMax = 0x96;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  lVar29 = 0x96;
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  local_ac = nCutMax;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vDivs = pVVar14;
  uVar33 = 1 << ((byte)nCutMax & 0x1f);
  uVar13 = uVar33 >> 5;
  if ((int)uVar33 < 0x21) {
    uVar13 = 1;
  }
  p_00->nBits = uVar33;
  p_00->nWords = uVar13;
  pAVar16 = (Abc_Obj_t *)malloc((ulong)(uVar13 * 0x97) << 2);
  p_00->pInfo = (uint *)pAVar16;
  uVar17 = (ulong)(uVar13 * 4);
  local_88 = (Abc_Obj_t *)(ulong)uVar13;
  memset(pAVar16,0,(long)(int)local_ac * uVar17);
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vSims = pVVar14;
  local_a8 = pAVar16;
  do {
    uVar13 = pVVar14->nCap;
    if (pVVar14->nSize == uVar13) {
      if ((int)uVar13 < 0x10) {
        if (pVVar14->pArray == (void **)0x0) {
          ppvVar15 = (void **)malloc(0x80);
        }
        else {
          ppvVar15 = (void **)realloc(pVVar14->pArray,0x80);
        }
        iVar12 = 0x10;
      }
      else {
        iVar12 = uVar13 * 2;
        if (iVar12 <= (int)uVar13) goto LAB_002ff93a;
        if (pVVar14->pArray == (void **)0x0) {
          ppvVar15 = (void **)malloc((ulong)uVar13 << 4);
        }
        else {
          ppvVar15 = (void **)realloc(pVVar14->pArray,(ulong)uVar13 << 4);
        }
      }
      pVVar14->pArray = ppvVar15;
      pVVar14->nCap = iVar12;
    }
LAB_002ff93a:
    iVar12 = pVVar14->nSize;
    pVVar14->nSize = iVar12 + 1;
    pVVar14->pArray[iVar12] = pAVar16;
    pAVar16 = (Abc_Obj_t *)((long)&pAVar16->pNtk + uVar17);
    lVar29 = lVar29 + -1;
  } while (lVar29 != 0);
  puVar1 = (uint *)((long)&local_a8->pNtk + (ulong)(uint)((int)local_88 * 0x96) * 4);
  p_00->pCareSet = puVar1;
  memset(puVar1,0xff,uVar17);
  pNtk_00 = local_90;
  uVar13 = local_ac;
  if (0 < (int)local_ac) {
    ppvVar15 = pVVar14->pArray;
    if ((int)uVar33 < 2) {
      uVar33 = 1;
    }
    uVar17 = 0;
    do {
      if (local_ac != 0x1f) {
        pvVar4 = ppvVar15[uVar17];
        uVar21 = 0;
        do {
          if ((uVar21 & 1 << ((byte)uVar17 & 0x1f)) != 0) {
            puVar1 = (uint *)((long)pvVar4 + (ulong)(uVar21 >> 5) * 4);
            *puVar1 = *puVar1 | 1 << ((byte)uVar21 & 0x1f);
          }
          uVar21 = uVar21 + 1;
        } while (uVar33 != uVar21);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != local_ac);
  }
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vDivs1UP = pVVar14;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vDivs1UN = pVVar14;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vDivs1B = pVVar14;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vDivs2UP0 = pVVar14;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vDivs2UP1 = pVVar14;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nCap = 0x96;
  pVVar14->nSize = 0;
  ppvVar15 = (void **)malloc(0x4b0);
  pVVar14->pArray = ppvVar15;
  p_00->vDivs2UN0 = pVVar14;
  iVar12 = p_00->nDivsMax;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  iVar22 = 8;
  if (6 < iVar12 - 1U) {
    iVar22 = iVar12;
  }
  pVVar14->nSize = 0;
  pVVar14->nCap = iVar22;
  if (iVar22 == 0) {
    ppvVar15 = (void **)0x0;
  }
  else {
    ppvVar15 = (void **)malloc((long)iVar22 * 8);
  }
  pVVar14->pArray = ppvVar15;
  p_00->vDivs2UN1 = pVVar14;
  pVVar14 = (Vec_Ptr_t *)malloc(0x10);
  pVVar14->nSize = 0;
  pVVar14->nCap = iVar22;
  if (iVar22 == 0) {
    ppvVar15 = (void **)0x0;
  }
  else {
    ppvVar15 = (void **)malloc((long)iVar22 << 3);
  }
  pVVar14->pArray = ppvVar15;
  p_00->vTemp = pVVar14;
  if ((int)local_a0 < 1) {
    local_68 = (Odc_Man_t *)0x0;
  }
  else {
    local_68 = Abc_NtkDontCareAlloc(uVar13,(int)local_a0,local_74,fVeryVerbose);
  }
  if (local_94 != 0) {
    Abc_NtkStartReverseLevels(pNtk_00,0);
  }
  if (pNtk_00->nObjCounts[8] != 0) {
    lVar29 = (long)pNtk_00->vBoxes->nSize;
    if (0 < lVar29) {
      ppvVar15 = pNtk_00->vBoxes->pArray;
      lVar23 = 0;
      do {
        pvVar4 = ppvVar15[lVar23];
        if ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 8) {
          *(undefined8 *)((long)pvVar4 + 8) = *(undefined8 *)((long)pvVar4 + 0x38);
        }
        lVar23 = lVar23 + 1;
      } while (lVar29 != lVar23);
    }
  }
  p_00->nNodesBeg = pNtk_00->nObjCounts[7];
  iVar12 = pNtk_00->vObjs->nSize;
  p_01 = Extra_ProgressBarStart(_stdout,iVar12);
  pVVar14 = pNtk_00->vObjs;
  if (0 < pVVar14->nSize) {
    local_38 = (long)iVar12;
    lVar29 = 0;
    local_80 = p_01;
    do {
      pAVar16 = (Abc_Obj_t *)pVVar14->pArray[lVar29];
      if ((pAVar16 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar16->field_0x14 & 0xf) == 7)) {
        local_a8 = pAVar16;
        if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= lVar29)) {
          Extra_ProgressBarUpdate_int(local_80,(int)lVar29,(char *)0x0);
          p_01 = local_80;
        }
        if (((ulong)local_a8 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_00301979:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (local_a8->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_00301979;
        }
        if ((local_a8->vFanins).nSize != 2) {
          __assert_fail("Abc_AigNodeIsAnd(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x193,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
        }
        if (((local_a8->field_0x15 & 2) != 0) || (1000 < (local_a8->vFanouts).nSize))
        goto LAB_00301004;
        if (local_38 <= lVar29) break;
        local_40 = lVar29;
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar29 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
          lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000;
        }
        local_a0 = Abc_NodeFindCut(local_48,local_a8,0);
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar23 = -1;
        }
        else {
          lVar23 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
        }
        p_00->timeCut = p_00->timeCut + lVar23 + lVar29;
        pVVar14 = local_a0;
        if (local_68 != (Odc_Man_t *)0x0) {
          iVar12 = clock_gettime(3,&local_c0);
          p = local_68;
          if (iVar12 < 0) {
            lVar29 = 1;
          }
          else {
            lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
            lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000;
          }
          Abc_NtkDontCareClear(local_68);
          pVVar14 = local_a0;
          Abc_NtkDontCareCompute(p,local_a8,local_a0,p_00->pCareSet);
          iVar12 = clock_gettime(3,&local_c0);
          if (iVar12 < 0) {
            lVar23 = -1;
          }
          else {
            lVar23 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
          }
          p_00->timeTruth = p_00->timeTruth + lVar23 + lVar29;
        }
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          local_50 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
          local_50 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000;
        }
        if (local_94 == 0) {
          uVar13 = 1000000000;
        }
        else {
          uVar13 = Abc_ObjRequiredLevel(local_a8);
        }
        if (local_98 < 0) {
          __assert_fail("nSteps >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                        ,0x753,
                        "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                       );
        }
        if (3 < local_98) {
          __assert_fail("nSteps <= 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                        ,0x754,
                        "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                       );
        }
        p_00->pRoot = local_a8;
        p_00->nLeaves = pVVar14->nSize;
        p_00->nLastGain = -1;
        local_ac = uVar13;
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar29 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
          lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000;
        }
        iVar12 = Abc_NodeMffcInside(local_a8,local_a0,p_00->vTemp);
        p_00->nMffc = iVar12;
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar23 = -1;
        }
        else {
          lVar23 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
        }
        p_00->timeMffc = p_00->timeMffc + lVar23 + lVar29;
        if (p_00->nMffc < 1) {
          __assert_fail("p->nMffc > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                        ,0x75d,
                        "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                       );
        }
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          local_58 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
          local_58 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000;
        }
        p_00->vDivs1UP->nSize = 0;
        p_00->vDivs1UN->nSize = 0;
        p_00->vDivs1B->nSize = 0;
        p_00->vDivs->nSize = 0;
        pAVar5 = local_a8->pNtk;
        if ((pAVar5->vTravIds).pArray == (int *)0x0) {
          iVar12 = pAVar5->vObjs->nSize;
          uVar17 = (long)iVar12 + 500;
          iVar22 = (int)uVar17;
          if ((pAVar5->vTravIds).nCap < iVar22) {
            piVar18 = (int *)malloc(uVar17 * 4);
            (pAVar5->vTravIds).pArray = piVar18;
            if (piVar18 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (pAVar5->vTravIds).nCap = iVar22;
          }
          if (-500 < iVar12) {
            memset((pAVar5->vTravIds).pArray,0,(uVar17 & 0xffffffff) << 2);
          }
          (pAVar5->vTravIds).nSize = iVar22;
        }
        iVar12 = pAVar5->nTravIds;
        pAVar5->nTravIds = iVar12 + 1;
        if (0x3ffffffe < iVar12) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        if (0 < local_a0->nSize) {
          lVar29 = 0;
          do {
            plVar6 = (long *)local_a0->pArray[lVar29];
            pVVar14 = p_00->vDivs;
            uVar13 = pVVar14->nCap;
            if (pVVar14->nSize == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (pVVar14->pArray == (void **)0x0) {
                  ppvVar15 = (void **)malloc(0x80);
                }
                else {
                  ppvVar15 = (void **)realloc(pVVar14->pArray,0x80);
                }
                pVVar14->pArray = ppvVar15;
                iVar12 = 0x10;
              }
              else {
                iVar12 = uVar13 * 2;
                if (iVar12 <= (int)uVar13) goto LAB_003000eb;
                if (pVVar14->pArray == (void **)0x0) {
                  ppvVar15 = (void **)malloc((ulong)uVar13 << 4);
                }
                else {
                  ppvVar15 = (void **)realloc(pVVar14->pArray,(ulong)uVar13 << 4);
                }
                pVVar14->pArray = ppvVar15;
              }
              pVVar14->nCap = iVar12;
            }
LAB_003000eb:
            iVar12 = pVVar14->nSize;
            iVar22 = iVar12 + 1;
            pVVar14->nSize = iVar22;
            pVVar14->pArray[iVar12] = plVar6;
            lVar23 = *plVar6;
            uVar3 = *(undefined4 *)(lVar23 + 0xd8);
            iVar12 = (int)plVar6[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar23 + 0xe0),iVar12 + 1,iVar22);
            if (((long)iVar12 < 0) || (*(int *)(lVar23 + 0xe4) <= iVar12)) {
LAB_0030190c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(undefined4 *)(*(long *)(lVar23 + 0xe8) + (long)iVar12 * 4) = uVar3;
            lVar29 = lVar29 + 1;
          } while (lVar29 < local_a0->nSize);
        }
        pVVar14 = p_00->vTemp;
        if (0 < pVVar14->nSize) {
          lVar29 = 0;
          do {
            puVar1 = (uint *)((long)pVVar14->pArray[lVar29] + 0x14);
            *puVar1 = *puVar1 | 0x10;
            lVar29 = lVar29 + 1;
            pVVar14 = p_00->vTemp;
          } while (lVar29 < pVVar14->nSize);
        }
        Abc_ManResubCollectDivs_rec(local_a8,p_00->vDivs);
        pVVar14 = p_00->vTemp;
        iVar12 = pVVar14->nSize;
        if (0 < iVar12) {
          lVar29 = 0;
          do {
            puVar1 = (uint *)((long)pVVar14->pArray[lVar29] + 0x14);
            *puVar1 = *puVar1 & 0xffffffef;
            lVar29 = lVar29 + 1;
            pVVar14 = p_00->vTemp;
            iVar12 = pVVar14->nSize;
          } while (lVar29 < iVar12);
        }
        pVVar14 = p_00->vDivs;
        iVar12 = (pVVar14->nSize - local_a0->nSize) + iVar12;
        local_70 = p_00->vSims->nSize;
        if (local_70 - p_00->nLeavesMax <= iVar12) goto LAB_00300eb8;
        if (0 < pVVar14->nSize) {
          uVar13 = iVar12 + p_00->nLeavesMax;
          uVar17 = (ulong)uVar13;
          local_70 = local_70 - uVar13;
          local_88 = (Abc_Obj_t *)0x0;
          local_6c = 0;
          uVar13 = local_ac;
          do {
            plVar6 = (long *)pVVar14->pArray[(long)local_88];
            if (*(int *)((long)plVar6 + 0x2c) - 1U < 100) {
              lVar29 = 0;
              do {
                plVar7 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                   (long)*(int *)(plVar6[6] + lVar29 * 4) * 8);
                lVar23 = *plVar7;
                iVar12 = (int)plVar7[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar23 + 0xe0),iVar12 + 1,(int)uVar17);
                if (((long)iVar12 < 0) || (*(int *)(lVar23 + 0xe4) <= iVar12)) goto LAB_003018ed;
                uVar17 = extraout_RDX;
                if (*(int *)(*(long *)(lVar23 + 0xe8) + (long)iVar12 * 4) !=
                    *(int *)(*plVar7 + 0xd8)) {
                  uVar33 = *(uint *)((long)plVar7 + 0x14) >> 0xc;
                  uVar17 = (ulong)uVar33;
                  if (((int)uVar33 <= (int)uVar13) &&
                     (1 < (*(uint *)((long)plVar7 + 0x14) & 0xf) - 3)) {
                    plVar8 = *(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                       (long)*(int *)plVar7[4] * 8);
                    lVar23 = *plVar8;
                    iVar12 = (int)plVar8[2];
                    Vec_IntFillExtra((Vec_Int_t *)(lVar23 + 0xe0),iVar12 + 1,uVar33);
                    if (((long)iVar12 < 0) || (*(int *)(lVar23 + 0xe4) <= iVar12)) {
LAB_003018ed:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                    }
                    uVar17 = extraout_RDX_00;
                    uVar13 = local_ac;
                    if (*(int *)(*(long *)(lVar23 + 0xe8) + (long)iVar12 * 4) ==
                        *(int *)(*plVar8 + 0xd8)) {
                      plVar8 = *(long **)(*(long *)(*(long *)(*plVar7 + 0x20) + 8) +
                                         (long)*(int *)(plVar7[4] + 4) * 8);
                      lVar23 = *plVar8;
                      iVar12 = (int)plVar8[2];
                      Vec_IntFillExtra((Vec_Int_t *)(lVar23 + 0xe0),iVar12 + 1,(int)extraout_RDX_00)
                      ;
                      if (((long)iVar12 < 0) || (*(int *)(lVar23 + 0xe4) <= iVar12))
                      goto LAB_003018ed;
                      uVar17 = extraout_RDX_01;
                      uVar13 = local_ac;
                      if (*(int *)(*(long *)(lVar23 + 0xe8) + (long)iVar12 * 4) ==
                          *(int *)(*plVar8 + 0xd8)) {
                        lVar23 = *(long *)(*(long *)(*plVar7 + 0x20) + 8);
                        uVar17 = (ulong)*(int *)plVar7[4];
                        if ((*(Abc_Obj_t **)(lVar23 + uVar17 * 8) != local_a8) &&
                           (*(Abc_Obj_t **)(lVar23 + (long)((int *)plVar7[4])[1] * 8) != local_a8))
                        {
                          pVVar14 = p_00->vDivs;
                          uVar13 = pVVar14->nCap;
                          if (pVVar14->nSize == uVar13) {
                            if ((int)uVar13 < 0x10) {
                              if (pVVar14->pArray == (void **)0x0) {
                                ppvVar15 = (void **)malloc(0x80);
                              }
                              else {
                                ppvVar15 = (void **)realloc(pVVar14->pArray,0x80);
                              }
                              pVVar14->pArray = ppvVar15;
                              iVar12 = 0x10;
                            }
                            else {
                              iVar12 = uVar13 * 2;
                              if (iVar12 <= (int)uVar13) goto LAB_0030041f;
                              if (pVVar14->pArray == (void **)0x0) {
                                ppvVar15 = (void **)malloc((ulong)uVar13 << 4);
                              }
                              else {
                                ppvVar15 = (void **)realloc(pVVar14->pArray,(ulong)uVar13 << 4);
                              }
                              pVVar14->pArray = ppvVar15;
                            }
                            pVVar14->nCap = iVar12;
                          }
LAB_0030041f:
                          iVar12 = pVVar14->nSize;
                          iVar22 = iVar12 + 1;
                          pVVar14->nSize = iVar22;
                          pVVar14->pArray[iVar12] = plVar7;
                          lVar23 = *plVar7;
                          uVar3 = *(undefined4 *)(lVar23 + 0xd8);
                          iVar12 = (int)plVar7[2];
                          Vec_IntFillExtra((Vec_Int_t *)(lVar23 + 0xe0),iVar12 + 1,iVar22);
                          if (((long)iVar12 < 0) || (*(int *)(lVar23 + 0xe4) <= iVar12))
                          goto LAB_0030190c;
                          *(undefined4 *)(*(long *)(lVar23 + 0xe8) + (long)iVar12 * 4) = uVar3;
                          local_6c = local_6c + 1;
                          uVar17 = extraout_RDX_02;
                          uVar13 = local_ac;
                          if (local_6c == local_70) goto LAB_003004b0;
                        }
                      }
                    }
                  }
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 < *(int *)((long)plVar6 + 0x2c));
            }
            local_88 = (Abc_Obj_t *)((long)&local_88->pNtk + 1);
            pVVar14 = p_00->vDivs;
          } while ((long)local_88 < (long)pVVar14->nSize);
        }
LAB_003004b0:
        pVVar14 = p_00->vTemp;
        p_00->nDivs = p_00->vDivs->nSize;
        if (0 < pVVar14->nSize) {
          lVar29 = 0;
          do {
            pvVar4 = pVVar14->pArray[lVar29];
            pVVar14 = p_00->vDivs;
            uVar13 = pVVar14->nCap;
            if (pVVar14->nSize == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (pVVar14->pArray == (void **)0x0) {
                  ppvVar15 = (void **)malloc(0x80);
                }
                else {
                  ppvVar15 = (void **)realloc(pVVar14->pArray,0x80);
                }
                pVVar14->pArray = ppvVar15;
                iVar12 = 0x10;
              }
              else {
                iVar12 = uVar13 * 2;
                if (iVar12 <= (int)uVar13) goto LAB_00300548;
                if (pVVar14->pArray == (void **)0x0) {
                  ppvVar15 = (void **)malloc((ulong)uVar13 << 4);
                }
                else {
                  ppvVar15 = (void **)realloc(pVVar14->pArray,(ulong)uVar13 << 4);
                }
                pVVar14->pArray = ppvVar15;
              }
              pVVar14->nCap = iVar12;
            }
LAB_00300548:
            iVar12 = pVVar14->nSize;
            pVVar14->nSize = iVar12 + 1;
            pVVar14->pArray[iVar12] = pvVar4;
            lVar29 = lVar29 + 1;
            pVVar14 = p_00->vTemp;
          } while (lVar29 < pVVar14->nSize);
        }
        pNtk_00 = local_90;
        iVar12 = p_00->vDivs->nSize;
        if ((long)iVar12 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
        }
        if ((Abc_Obj_t *)p_00->vDivs->pArray[(long)iVar12 + -1] != local_a8) {
          __assert_fail("pRoot == Vec_PtrEntryLast(p->vDivs)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                        ,0x1f5,
                        "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                       );
        }
        if (p_00->vSims->nSize - p_00->nLeavesMax < iVar12 - local_a0->nSize) {
          __assert_fail("Vec_PtrSize(p->vDivs) - Vec_PtrSize(vLeaves) <= Vec_PtrSize(p->vSims) - p->nLeavesMax"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                        ,0x1f7,
                        "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)"
                       );
        }
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar29 = -1;
        }
        else {
          lVar29 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
        }
        p_00->timeDiv = p_00->timeDiv + lVar29 + local_58;
        p_00->nTotalDivs = p_00->nTotalDivs + p_00->nDivs;
        p_00->nTotalLeaves = p_00->nTotalLeaves + p_00->nLeaves;
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar29 = 1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
          lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000;
        }
        pVVar14 = p_00->vDivs;
        iVar12 = p_00->nLeaves;
        pVVar9 = p_00->vSims;
        iVar22 = p_00->nLeavesMax;
        if (pVVar9->nSize - iVar22 < pVVar14->nSize - iVar12) {
          __assert_fail("Vec_PtrSize(vDivs) - nLeaves <= Vec_PtrSize(vSims) - nLeavesMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                        ,0x23d,"void Abc_ManResubSimulate(Vec_Ptr_t *, int, Vec_Ptr_t *, int, int)")
          ;
        }
        uVar13 = p_00->nWords;
        uVar17 = (ulong)uVar13;
        if (0 < pVVar14->nSize) {
          lVar23 = 0;
          do {
            plVar6 = (long *)pVVar14->pArray[lVar23];
            if (lVar23 < iVar12) {
              if (pVVar9->nSize <= lVar23) goto LAB_0030192b;
              plVar6[7] = (long)pVVar9->pArray[lVar23];
            }
            else {
              lVar27 = (lVar23 - iVar12) + (long)iVar22;
              if ((lVar27 < 0) || (pVVar9->nSize <= lVar27)) goto LAB_0030192b;
              pvVar4 = pVVar9->pArray[lVar27];
              plVar6[7] = (long)pvVar4;
              lVar27 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
              lVar10 = *(long *)(*(long *)(lVar27 + (long)*(int *)plVar6[4] * 8) + 0x38);
              lVar27 = *(long *)(*(long *)(lVar27 + (long)((int *)plVar6[4])[1] * 8) + 0x38);
              uVar33 = *(uint *)((long)plVar6 + 0x14);
              if ((uVar33 >> 10 & 1) == 0) {
                if ((uVar33 >> 0xb & 1) == 0) {
                  if (0 < (int)uVar13) {
                    uVar25 = 0;
                    do {
                      *(uint *)((long)pvVar4 + uVar25 * 4) =
                           *(uint *)(lVar27 + uVar25 * 4) & *(uint *)(lVar10 + uVar25 * 4);
                      uVar25 = uVar25 + 1;
                    } while (uVar17 != uVar25);
                  }
                }
                else if (0 < (int)uVar13) {
                  uVar25 = 0;
                  do {
                    *(uint *)((long)pvVar4 + uVar25 * 4) =
                         ~*(uint *)(lVar27 + uVar25 * 4) & *(uint *)(lVar10 + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
              }
              else if ((uVar33 >> 0xb & 1) == 0) {
                if (0 < (int)uVar13) {
                  uVar25 = 0;
                  do {
                    *(uint *)((long)pvVar4 + uVar25 * 4) =
                         ~*(uint *)(lVar10 + uVar25 * 4) & *(uint *)(lVar27 + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar17 != uVar25);
                }
              }
              else if (0 < (int)uVar13) {
                uVar25 = 0;
                do {
                  *(uint *)((long)pvVar4 + uVar25 * 4) =
                       ~(*(uint *)(lVar27 + uVar25 * 4) | *(uint *)(lVar10 + uVar25 * 4));
                  uVar25 = uVar25 + 1;
                } while (uVar17 != uVar25);
              }
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar14->nSize);
        }
        if (0 < pVVar14->nSize) {
          lVar23 = 0;
          do {
            pvVar4 = pVVar14->pArray[lVar23];
            puVar1 = *(uint **)((long)pvVar4 + 0x38);
            uVar33 = *puVar1;
            *(uint *)((long)pvVar4 + 0x14) =
                 *(uint *)((long)pvVar4 + 0x14) & 0xffffff7f | (uVar33 & 1) << 7;
            if ((0 < (int)uVar13) && ((uVar33 & 1) != 0)) {
              uVar25 = 0;
              do {
                puVar2 = puVar1 + uVar25;
                *puVar2 = ~*puVar2;
                uVar25 = uVar25 + 1;
              } while (uVar17 != uVar25);
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar14->nSize);
        }
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar23 = -1;
        }
        else {
          lVar23 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
        }
        p_00->timeSim = p_00->timeSim + lVar23 + lVar29;
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          pVVar14 = (Vec_Ptr_t *)0x1;
        }
        else {
          lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
          pVVar14 = (Vec_Ptr_t *)(((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000);
        }
        pAVar16 = p_00->pRoot;
        uVar13 = p_00->nWords;
        if ((int)uVar13 < 1) {
          uVar17 = 0;
        }
        else {
          uVar17 = 0;
          do {
            if ((*(uint *)((long)(pAVar16->field_5).pData + uVar17 * 4) & p_00->pCareSet[uVar17]) !=
                0) goto LAB_003008e3;
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
          uVar17 = (ulong)uVar13;
        }
LAB_003008e3:
        if ((uint)uVar17 == uVar13) {
          if ((pAVar16->field_0x14 & 0x80) == 0) {
            pGraph = (Dec_Graph_t *)malloc(0x20);
            pGraph->fConst = 0;
            pGraph->nLeaves = 0;
            pGraph->nSize = 0;
            pGraph->nCap = 0;
            pGraph->pNodes = (Dec_Node_t *)0x0;
            *(undefined8 *)&pGraph->eRoot = 0;
            pGraph->fConst = 1;
            *(byte *)&pGraph->eRoot = *(byte *)&pGraph->eRoot | 1;
          }
          else {
            pGraph = (Dec_Graph_t *)malloc(0x20);
            pGraph->fConst = 0;
            pGraph->nLeaves = 0;
            pGraph->nSize = 0;
            pGraph->nCap = 0;
            pGraph->pNodes = (Dec_Node_t *)0x0;
            *(undefined8 *)&pGraph->eRoot = 0;
            pGraph->fConst = 1;
          }
        }
        else {
          pGraph = (Dec_Graph_t *)0x0;
        }
        if (pGraph == (Dec_Graph_t *)0x0) {
          if (0 < (long)p_00->nDivs) {
            uVar33 = p_00->vDivs->nSize;
            if ((int)uVar33 < 1) {
              uVar33 = 0;
            }
            uVar17 = 0;
            do {
              if (uVar17 == uVar33) goto LAB_0030192b;
              pAVar11 = (Abc_Obj_t *)p_00->vDivs->pArray[uVar17];
              if ((int)uVar13 < 1) {
                uVar25 = 0;
              }
              else {
                uVar25 = 0;
                do {
                  if ((p_00->pCareSet[uVar25] &
                      (*(uint *)((long)(pAVar16->field_5).pData + uVar25 * 4) ^
                      *(uint *)((long)(pAVar11->field_5).pData + uVar25 * 4))) != 0)
                  goto LAB_003009b6;
                  uVar25 = uVar25 + 1;
                } while (uVar13 != uVar25);
                uVar25 = (ulong)uVar13;
              }
LAB_003009b6:
              if ((uint)uVar25 == uVar13) {
                pGraph = Abc_ManResubQuit0(pAVar16,pAVar11);
                goto LAB_003009d3;
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != (long)p_00->nDivs);
          }
          pGraph = (Dec_Graph_t *)0x0;
LAB_003009d3:
          if (pGraph != (Dec_Graph_t *)0x0) {
            iVar12 = clock_gettime(3,&local_c0);
            if (iVar12 < 0) {
              lVar29 = -1;
            }
            else {
              lVar29 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
            }
            p_00->timeRes1 = (long)&pVVar14->nCap + p_00->timeRes1 + lVar29;
            p_00->nUsedNode0 = p_00->nUsedNode0 + 1;
            goto LAB_00300a83;
          }
          if ((local_98 != 0) && (p_00->nMffc != 1)) {
            p_00->vDivs1UP->nSize = 0;
            p_00->vDivs1UN->nSize = 0;
            p_00->vDivs1B->nSize = 0;
            local_a0 = pVVar14;
            if (0 < p_00->nDivs) {
              pvVar4 = (p_00->pRoot->field_5).pData;
              lVar29 = 0;
              do {
                if (p_00->vDivs->nSize <= lVar29) {
LAB_0030192b:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pvVar30 = p_00->vDivs->pArray[lVar29];
                if ((int)(*(uint *)((long)pvVar30 + 0x14) >> 0xc) < (int)local_ac) {
                  lVar23 = *(long *)((long)pvVar30 + 0x38);
                  uVar13 = p_00->nWords;
                  uVar17 = (ulong)uVar13;
                  if ((int)uVar13 < 1) {
                    uVar25 = 0;
                  }
                  else {
                    uVar25 = 0;
                    do {
                      if ((p_00->pCareSet[uVar25] &
                          ~*(uint *)((long)pvVar4 + uVar25 * 4) & *(uint *)(lVar23 + uVar25 * 4)) !=
                          0) goto LAB_00300b17;
                      uVar25 = uVar25 + 1;
                    } while (uVar17 != uVar25);
                    uVar25 = (ulong)uVar13;
                  }
LAB_00300b17:
                  if ((uint)uVar25 == uVar13) {
                    pVVar14 = p_00->vDivs1UP;
                  }
                  else {
                    if ((int)uVar13 < 1) {
                      uVar25 = 0;
                    }
                    else {
                      uVar25 = 0;
                      do {
                        if ((p_00->pCareSet[uVar25] &
                            ~(*(uint *)((long)pvVar4 + uVar25 * 4) | *(uint *)(lVar23 + uVar25 * 4))
                            ) != 0) goto LAB_00300b4a;
                        uVar25 = uVar25 + 1;
                      } while (uVar17 != uVar25);
                      uVar25 = (ulong)uVar13;
                    }
LAB_00300b4a:
                    if ((uint)uVar25 == uVar13) {
                      pVVar14 = p_00->vDivs1UP;
LAB_00300b52:
                      pvVar30 = (void *)((ulong)pvVar30 ^ 1);
                    }
                    else {
                      if ((int)uVar13 < 1) {
                        uVar25 = 0;
                      }
                      else {
                        uVar25 = 0;
                        do {
                          if ((p_00->pCareSet[uVar25] &
                              ~*(uint *)(lVar23 + uVar25 * 4) & *(uint *)((long)pvVar4 + uVar25 * 4)
                              ) != 0) goto LAB_00300b7e;
                          uVar25 = uVar25 + 1;
                        } while (uVar17 != uVar25);
                        uVar25 = (ulong)uVar13;
                      }
LAB_00300b7e:
                      if ((uint)uVar25 == uVar13) {
                        pVVar14 = p_00->vDivs1UN;
                      }
                      else {
                        if ((int)uVar13 < 1) {
                          uVar25 = 0;
                        }
                        else {
                          uVar25 = 0;
                          do {
                            if ((p_00->pCareSet[uVar25] &
                                *(uint *)((long)pvVar4 + uVar25 * 4) &
                                *(uint *)(lVar23 + uVar25 * 4)) != 0) goto LAB_00300bac;
                            uVar25 = uVar25 + 1;
                          } while (uVar17 != uVar25);
                          uVar25 = (ulong)uVar13;
                        }
LAB_00300bac:
                        if ((uint)uVar25 == uVar13) {
                          pVVar14 = p_00->vDivs1UN;
                          goto LAB_00300b52;
                        }
                        pVVar14 = p_00->vDivs1B;
                      }
                    }
                  }
                  uVar13 = pVVar14->nCap;
                  if (pVVar14->nSize == uVar13) {
                    if ((int)uVar13 < 0x10) {
                      if (pVVar14->pArray == (void **)0x0) {
                        ppvVar15 = (void **)malloc(0x80);
                      }
                      else {
                        ppvVar15 = (void **)realloc(pVVar14->pArray,0x80);
                      }
                      pVVar14->pArray = ppvVar15;
                      iVar12 = 0x10;
                    }
                    else {
                      iVar12 = uVar13 * 2;
                      if (iVar12 <= (int)uVar13) goto LAB_00300c20;
                      if (pVVar14->pArray == (void **)0x0) {
                        ppvVar15 = (void **)malloc((ulong)uVar13 << 4);
                      }
                      else {
                        ppvVar15 = (void **)realloc(pVVar14->pArray,(ulong)uVar13 << 4);
                      }
                      pVVar14->pArray = ppvVar15;
                    }
                    pVVar14->nCap = iVar12;
                  }
LAB_00300c20:
                  iVar12 = pVVar14->nSize;
                  pVVar14->nSize = iVar12 + 1;
                  pVVar14->pArray[iVar12] = pvVar30;
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 < p_00->nDivs);
            }
            local_88 = p_00->pRoot;
            pvVar4 = (local_88->field_5).pData;
            uVar17 = (ulong)p_00->vDivs1UP->nSize;
            if (0 < (long)uVar17) {
              ppvVar15 = p_00->vDivs1UP->pArray;
              uVar28 = 1;
              uVar25 = 0;
              do {
                uVar26 = uVar25 + 1;
                if (uVar26 < uVar17) {
                  pAVar16 = (Abc_Obj_t *)ppvVar15[uVar25];
                  lVar29 = *(long *)(((ulong)pAVar16 & 0xfffffffffffffffe) + 0x38);
                  uVar13 = p_00->nWords;
                  uVar24 = (ulong)uVar13;
                  uVar25 = uVar28;
                  do {
                    pAVar11 = (Abc_Obj_t *)ppvVar15[uVar25];
                    lVar23 = *(long *)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x38);
                    if (((uint)pAVar16 & 1 & (uint)pAVar11) == 0) {
                      if (((ulong)pAVar16 & 1) == 0) {
                        if (((ulong)pAVar11 & 1) == 0) {
                          if ((int)uVar13 < 1) {
LAB_00300d8b:
                            uVar32 = 0;
                          }
                          else {
                            uVar31 = 0;
                            do {
                              uVar32 = uVar31;
                              if ((p_00->pCareSet[uVar31] &
                                  ((*(uint *)(lVar23 + uVar31 * 4) | *(uint *)(lVar29 + uVar31 * 4))
                                  ^ *(uint *)((long)pvVar4 + uVar31 * 4))) != 0) break;
                              uVar31 = uVar31 + 1;
                              uVar32 = uVar24;
                            } while (uVar24 != uVar31);
                          }
                        }
                        else {
                          if ((int)uVar13 < 1) goto LAB_00300d8b;
                          uVar31 = 0;
                          do {
                            uVar32 = uVar31;
                            if ((p_00->pCareSet[uVar31] &
                                ((~*(uint *)(lVar23 + uVar31 * 4) | *(uint *)(lVar29 + uVar31 * 4))
                                ^ *(uint *)((long)pvVar4 + uVar31 * 4))) != 0) break;
                            uVar31 = uVar31 + 1;
                            uVar32 = uVar24;
                          } while (uVar24 != uVar31);
                        }
                      }
                      else {
                        if ((int)uVar13 < 1) goto LAB_00300d8b;
                        uVar31 = 0;
                        do {
                          uVar32 = uVar31;
                          if ((p_00->pCareSet[uVar31] &
                              ((~*(uint *)(lVar29 + uVar31 * 4) | *(uint *)(lVar23 + uVar31 * 4)) ^
                              *(uint *)((long)pvVar4 + uVar31 * 4))) != 0) break;
                          uVar31 = uVar31 + 1;
                          uVar32 = uVar24;
                        } while (uVar24 != uVar31);
                      }
                    }
                    else {
                      if ((int)uVar13 < 1) goto LAB_00300d8b;
                      uVar31 = 0;
                      do {
                        uVar32 = uVar31;
                        if ((p_00->pCareSet[uVar31] &
                            ~(*(uint *)(lVar23 + uVar31 * 4) & *(uint *)(lVar29 + uVar31 * 4) ^
                             *(uint *)((long)pvVar4 + uVar31 * 4))) != 0) break;
                        uVar31 = uVar31 + 1;
                        uVar32 = uVar24;
                      } while (uVar24 != uVar31);
                    }
                    if ((uint)uVar32 == uVar13) {
                      p_00->nUsedNode1Or = p_00->nUsedNode1Or + 1;
                      pGraph = Abc_ManResubQuit1(local_88,pAVar16,pAVar11,1);
                      pNtk_00 = local_90;
                      goto LAB_0030105e;
                    }
                    uVar25 = uVar25 + 1;
                    pNtk_00 = local_90;
                  } while (uVar25 != uVar17);
                }
                uVar28 = uVar28 + 1;
                uVar25 = uVar26;
              } while (uVar26 != uVar17);
            }
            uVar17 = (ulong)p_00->vDivs1UN->nSize;
            if ((long)uVar17 < 1) {
              pGraph = (Dec_Graph_t *)0x0;
            }
            else {
              ppvVar15 = p_00->vDivs1UN->pArray;
              uVar28 = 1;
              uVar25 = 0;
              do {
                uVar26 = uVar25 + 1;
                if (uVar26 < uVar17) {
                  pAVar16 = (Abc_Obj_t *)ppvVar15[uVar25];
                  lVar29 = *(long *)(((ulong)pAVar16 & 0xfffffffffffffffe) + 0x38);
                  uVar13 = p_00->nWords;
                  uVar24 = (ulong)uVar13;
                  uVar25 = uVar28;
                  do {
                    pAVar11 = (Abc_Obj_t *)ppvVar15[uVar25];
                    lVar23 = *(long *)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x38);
                    if (((ulong)pAVar11 & 1) == 0) {
                      if ((int)uVar13 < 1) goto LAB_00300e74;
                      uVar31 = 0;
                      do {
                        uVar32 = uVar31;
                        if ((p_00->pCareSet[uVar31] &
                            (*(uint *)(lVar23 + uVar31 * 4) & *(uint *)(lVar29 + uVar31 * 4) ^
                            *(uint *)((long)pvVar4 + uVar31 * 4))) != 0) break;
                        uVar31 = uVar31 + 1;
                        uVar32 = uVar24;
                      } while (uVar24 != uVar31);
LAB_00300e6d:
                      uVar33 = (uint)uVar32;
                      pNtk_00 = local_90;
                    }
                    else {
                      if (0 < (int)uVar13) {
                        uVar31 = 0;
                        do {
                          uVar32 = uVar31;
                          if ((p_00->pCareSet[uVar31] &
                              (~*(uint *)(lVar23 + uVar31 * 4) & *(uint *)(lVar29 + uVar31 * 4) ^
                              *(uint *)((long)pvVar4 + uVar31 * 4))) != 0) break;
                          uVar31 = uVar31 + 1;
                          uVar32 = uVar24;
                        } while (uVar24 != uVar31);
                        goto LAB_00300e6d;
                      }
LAB_00300e74:
                      uVar33 = 0;
                    }
                    if (uVar33 == uVar13) {
                      p_00->nUsedNode1And = p_00->nUsedNode1And + 1;
                      pGraph = Abc_ManResubQuit1(local_88,pAVar16,pAVar11,0);
                      goto LAB_0030105e;
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 != uVar17);
                }
                uVar28 = uVar28 + 1;
                pGraph = (Dec_Graph_t *)0x0;
                uVar25 = uVar26;
              } while (uVar26 != uVar17);
            }
LAB_0030105e:
            aVar19 = Abc_Clock();
            if (pGraph == (Dec_Graph_t *)0x0) {
              p_00->timeRes1 = (long)&local_a0->nCap + p_00->timeRes1 + aVar19;
              if ((local_98 == 1) || (p_00->nMffc == 2)) goto LAB_00300eb8;
              aVar19 = Abc_Clock();
              uVar13 = local_ac;
              pGraph = Abc_ManResubDivs12(p_00,local_ac);
              aVar20 = Abc_Clock();
              if (pGraph == (Dec_Graph_t *)0x0) {
                p_00->timeRes2 = p_00->timeRes2 + (aVar20 - aVar19);
                aVar19 = Abc_Clock();
                Abc_ManResubDivsD(p_00,uVar13);
                aVar20 = Abc_Clock();
                p_00->timeResD = p_00->timeResD + (aVar20 - aVar19);
                aVar19 = Abc_Clock();
                pGraph = Abc_ManResubDivs2(p_00,uVar13);
                aVar20 = Abc_Clock();
                p_00->timeRes2 = p_00->timeRes2 + (aVar20 - aVar19);
                if (pGraph == (Dec_Graph_t *)0x0) {
                  if ((local_98 != 2) && (p_00->nMffc != 3)) {
                    aVar19 = Abc_Clock();
                    pGraph = Abc_ManResubDivs3(p_00,uVar13);
                    aVar20 = Abc_Clock();
                    if (pGraph != (Dec_Graph_t *)0x0) {
                      p_00->timeRes3 = p_00->timeRes3 + (aVar20 - aVar19);
                      iVar12 = p_00->nMffc + -3;
                      goto LAB_00300a86;
                    }
                    p_00->timeRes3 = p_00->timeRes3 + (aVar20 - aVar19);
                  }
                  goto LAB_00300eb8;
                }
              }
              else {
                p_00->timeRes2 = p_00->timeRes2 + (aVar20 - aVar19);
              }
              iVar12 = p_00->nMffc + -2;
            }
            else {
              p_00->timeRes1 = (long)&local_a0->nCap + p_00->timeRes1 + aVar19;
              iVar12 = p_00->nMffc + -1;
            }
            goto LAB_00300a86;
          }
          iVar12 = clock_gettime(3,&local_c0);
          if (iVar12 < 0) {
            lVar29 = -1;
          }
          else {
            lVar29 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
          }
          p_00->timeRes1 = (long)&pVVar14->nCap + p_00->timeRes1 + lVar29;
LAB_00300eb8:
          pGraph = (Dec_Graph_t *)0x0;
        }
        else {
          p_00->nUsedNodeC = p_00->nUsedNodeC + 1;
LAB_00300a83:
          iVar12 = p_00->nMffc;
LAB_00300a86:
          p_00->nLastGain = iVar12;
        }
        iVar12 = clock_gettime(3,&local_c0);
        if (iVar12 < 0) {
          lVar29 = -1;
        }
        else {
          lVar29 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
        }
        p_00->timeRes = p_00->timeRes + lVar29 + local_50;
        lVar29 = local_40;
        p_01 = local_80;
        if (pGraph != (Dec_Graph_t *)0x0) {
          p_00->nTotalGain = p_00->nTotalGain + p_00->nLastGain;
          iVar12 = clock_gettime(3,&local_c0);
          if (iVar12 < 0) {
            lVar29 = 1;
          }
          else {
            lVar29 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_c0.tv_nsec),8);
            lVar29 = ((lVar29 >> 7) - (lVar29 >> 0x3f)) + local_c0.tv_sec * -1000000;
          }
          Dec_GraphUpdateNetwork(local_a8,pGraph,local_94,p_00->nLastGain);
          iVar12 = clock_gettime(3,&local_c0);
          if (iVar12 < 0) {
            lVar23 = -1;
          }
          else {
            lVar23 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
          }
          p_00->timeNtk = p_00->timeNtk + lVar23 + lVar29;
          if (pGraph->pNodes != (Dec_Node_t *)0x0) {
            free(pGraph->pNodes);
            pGraph->pNodes = (Dec_Node_t *)0x0;
          }
          free(pGraph);
          lVar29 = local_40;
          p_01 = local_80;
        }
      }
LAB_00301004:
      lVar29 = lVar29 + 1;
      pVVar14 = pNtk_00->vObjs;
    } while (lVar29 < pVVar14->nSize);
  }
  Extra_ProgressBarStop(p_01);
  iVar12 = clock_gettime(3,&local_c0);
  if (iVar12 < 0) {
    lVar29 = -1;
  }
  else {
    lVar29 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
  }
  p_00->timeTotal = lVar29 - local_60;
  p_00->nNodesEnd = pNtk_00->nObjCounts[7];
  if (local_74 != 0) {
    iVar12 = 0x983562;
    printf("Used constants    = %6d.             ",(ulong)(uint)p_00->nUsedNodeC);
    Abc_Print(iVar12,"%s =","Cuts  ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeCut / 1000000.0,0));
    iVar12 = 0x98358f;
    printf("Used replacements = %6d.             ",(ulong)(uint)p_00->nUsedNode0);
    Abc_Print(iVar12,"%s =","Resub ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeRes / 1000000.0,0));
    iVar12 = 0x9835bc;
    printf("Used single ORs   = %6d.             ",(ulong)(uint)p_00->nUsedNode1Or);
    Abc_Print(iVar12,"%s ="," Div  ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeDiv / 1000000.0,0));
    iVar12 = 0x9835e9;
    printf("Used single ANDs  = %6d.             ",(ulong)(uint)p_00->nUsedNode1And);
    Abc_Print(iVar12,"%s ="," Mffc ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeMffc / 1000000.0,0));
    iVar12 = 0x983616;
    printf("Used double ORs   = %6d.             ",(ulong)(uint)p_00->nUsedNode2Or);
    Abc_Print(iVar12,"%s ="," Sim  ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeSim / 1000000.0,0));
    iVar12 = 0x983643;
    printf("Used double ANDs  = %6d.             ",(ulong)(uint)p_00->nUsedNode2And);
    Abc_Print(iVar12,"%s ="," 1    ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeRes1 / 1000000.0,0));
    iVar12 = 0x983670;
    printf("Used OR-AND       = %6d.             ",(ulong)(uint)p_00->nUsedNode2OrAnd);
    Abc_Print(iVar12,"%s ="," D    ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeResD / 1000000.0,0));
    iVar12 = 0x98369d;
    printf("Used AND-OR       = %6d.             ",(ulong)(uint)p_00->nUsedNode2AndOr);
    Abc_Print(iVar12,"%s ="," 2    ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeRes2 / 1000000.0,0));
    iVar12 = 0x9836ca;
    printf("Used OR-2ANDs     = %6d.             ",(ulong)(uint)p_00->nUsedNode3OrAnd);
    Abc_Print(iVar12,"%s =","Truth ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeTruth / 1000000.0,0));
    iVar12 = 0x9836f0;
    printf("Used AND-2ORs     = %6d.             ",(ulong)(uint)p_00->nUsedNode3AndOr);
    Abc_Print(iVar12,"%s =","AIG   ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeNtk / 1000000.0,0));
    iVar12 = 0x98371d;
    printf("TOTAL             = %6d.             ",
           (ulong)(uint)(p_00->nUsedNode0 + p_00->nUsedNodeC + p_00->nUsedNode1Or +
                         p_00->nUsedNode1And + p_00->nUsedNode2Or + p_00->nUsedNode2And +
                         p_00->nUsedNode2OrAnd + p_00->nUsedNode2AndOr + p_00->nUsedNode3OrAnd +
                        p_00->nUsedNode3AndOr));
    Abc_Print(iVar12,"%s =","TOTAL ");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)p_00->timeTotal / 1000000.0,0));
    printf("Total leaves   = %8d.\n",(ulong)(uint)p_00->nTotalLeaves);
    printf("Total divisors = %8d.\n",(ulong)(uint)p_00->nTotalDivs);
    printf("Gain           = %8d. (%6.2f %%).\n",
           SUB84(((double)(p_00->nNodesBeg - p_00->nNodesEnd) * 100.0) / (double)p_00->nNodesBeg,0))
    ;
  }
  pVVar14 = p_00->vDivs;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vSims;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vDivs1UP;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vDivs1UN;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vDivs1B;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vDivs2UP0;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vDivs2UP1;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vDivs2UN0;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vDivs2UN1;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  pVVar14 = p_00->vTemp;
  if (pVVar14->pArray != (void **)0x0) {
    free(pVVar14->pArray);
    pVVar14->pArray = (void **)0x0;
  }
  if (pVVar14 != (Vec_Ptr_t *)0x0) {
    free(pVVar14);
  }
  if (p_00->pInfo != (uint *)0x0) {
    free(p_00->pInfo);
    p_00->pInfo = (uint *)0x0;
  }
  if (p_00 != (Abc_ManRes_t *)0x0) {
    free(p_00);
  }
  Abc_NtkManCutStop(local_48);
  if (local_68 != (Odc_Man_t *)0x0) {
    Abc_NtkDontCareFree(local_68);
  }
  pVVar14 = pNtk_00->vObjs;
  if (0 < pVVar14->nSize) {
    lVar29 = 0;
    do {
      if (pVVar14->pArray[lVar29] != (void *)0x0) {
        *(undefined8 *)((long)pVVar14->pArray[lVar29] + 0x38) = 0;
      }
      lVar29 = lVar29 + 1;
      pVVar14 = pNtk_00->vObjs;
    } while (lVar29 < pVVar14->nSize);
  }
  if ((pNtk_00->nObjCounts[8] != 0) && (pVVar14 = pNtk_00->vBoxes, 0 < pVVar14->nSize)) {
    lVar29 = 0;
    do {
      pvVar4 = pVVar14->pArray[lVar29];
      if ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 8) {
        *(undefined8 *)((long)pvVar4 + 0x38) = *(undefined8 *)((long)pvVar4 + 8);
        *(undefined8 *)((long)pvVar4 + 8) = 0;
      }
      lVar29 = lVar29 + 1;
      pVVar14 = pNtk_00->vBoxes;
    } while (lVar29 < pVVar14->nSize);
  }
  Abc_NtkReassignIds(pNtk_00);
  if (local_94 == 0) {
    Abc_NtkLevel(pNtk_00);
  }
  else {
    Abc_NtkStopReverseLevels(pNtk_00);
  }
  iVar12 = Abc_NtkCheck(pNtk_00);
  if (iVar12 == 0) {
    puts("Abc_NtkRefactor: The network check has failed.");
    iVar12 = 0;
  }
  else {
    iVar12 = clock_gettime(3,&local_c0);
    if (iVar12 < 0) {
      lVar29 = -1;
    }
    else {
      lVar29 = local_c0.tv_nsec / 1000 + local_c0.tv_sec * 1000000;
    }
    s_ResubTime = lVar29 - local_60;
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

int Abc_NtkResubstitute( Abc_Ntk_t * pNtk, int nCutMax, int nStepsMax, int nLevelsOdc, int fUpdateLevel, int fVerbose, int fVeryVerbose )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Abc_ManRes_t * pManRes;
    Abc_ManCut_t * pManCut;
    Odc_Man_t * pManOdc = NULL;
    Dec_Graph_t * pFForm;
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pNode;
    abctime clk, clkStart = Abc_Clock();
    int i, nNodes;

    assert( Abc_NtkIsStrash(pNtk) );

    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    // start the managers
    pManCut = Abc_NtkManCutStart( nCutMax, 100000, 100000, 100000 );
    pManRes = Abc_ManResubStart( nCutMax, ABC_RS_DIV1_MAX );
    if ( nLevelsOdc > 0 )
    pManOdc = Abc_NtkDontCareAlloc( nCutMax, nLevelsOdc, fVerbose, fVeryVerbose );

    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pNext = (Abc_Obj_t *)pNode->pData;
    }

    // resynthesize each node once
    pManRes->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;

        // compute a reconvergence-driven cut
clk = Abc_Clock();
        vLeaves = Abc_NodeFindCut( pManCut, pNode, 0 );
//        vLeaves = Abc_CutFactorLarge( pNode, nCutMax );
pManRes->timeCut += Abc_Clock() - clk;
/*
        if ( fVerbose && vLeaves )
        printf( "Node %6d : Leaves = %3d. Volume = %3d.\n", pNode->Id, Vec_PtrSize(vLeaves), Abc_CutVolumeCheck(pNode, vLeaves) );
        if ( vLeaves == NULL )
            continue;
*/
        // get the don't-cares
        if ( pManOdc )
        {
clk = Abc_Clock();
            Abc_NtkDontCareClear( pManOdc );
            Abc_NtkDontCareCompute( pManOdc, pNode, vLeaves, pManRes->pCareSet );
pManRes->timeTruth += Abc_Clock() - clk;
        }

        // evaluate this cut
clk = Abc_Clock();
        pFForm = Abc_ManResubEval( pManRes, pNode, vLeaves, nStepsMax, fUpdateLevel, fVerbose );
//        Vec_PtrFree( vLeaves );
//        Abc_ManResubCleanup( pManRes );
pManRes->timeRes += Abc_Clock() - clk;
        if ( pFForm == NULL )
            continue;
        pManRes->nTotalGain += pManRes->nLastGain;
/*
        if ( pManRes->nLeaves == 4 && pManRes->nMffc == 2 && pManRes->nLastGain == 1 )
        {
            printf( "%6d :  L = %2d. V = %2d. Mffc = %2d. Divs = %3d.   Up = %3d. Un = %3d. B = %3d.\n", 
                   pNode->Id, pManRes->nLeaves, Abc_CutVolumeCheck(pNode, vLeaves), pManRes->nMffc, pManRes->nDivs, 
                   pManRes->vDivs1UP->nSize, pManRes->vDivs1UN->nSize, pManRes->vDivs1B->nSize );
            Abc_ManResubPrintDivs( pManRes, pNode, vLeaves );
        }
*/
        // acceptable replacement found, update the graph
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pFForm, fUpdateLevel, pManRes->nLastGain );
pManRes->timeNtk += Abc_Clock() - clk;
        Dec_GraphFree( pFForm );
    }
    Extra_ProgressBarStop( pProgress );
pManRes->timeTotal = Abc_Clock() - clkStart;
    pManRes->nNodesEnd = Abc_NtkNodeNum(pNtk);

    // print statistics
    if ( fVerbose )
    Abc_ManResubPrint( pManRes );

    // delete the managers
    Abc_ManResubStop( pManRes );
    Abc_NtkManCutStop( pManCut );
    if ( pManOdc ) Abc_NtkDontCareFree( pManOdc );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->pData = NULL;

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pData = pNode->pNext, pNode->pNext = NULL;
    }

    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRefactor: The network check has failed.\n" );
        return 0;
    }
s_ResubTime = Abc_Clock() - clkStart;
    return 1;
}